

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O2

FT_Error pcf_get_bdf_property(PCF_Face face,char *prop_name,BDF_PropertyRec *aproperty)

{
  FT_Error FVar1;
  PCF_Property pPVar2;
  
  pPVar2 = pcf_find_property(face,prop_name);
  if (pPVar2 == (PCF_Property)0x0) {
    FVar1 = 6;
  }
  else {
    if (pPVar2->isString == '\0') {
      aproperty->type = BDF_PROPERTY_TYPE_INTEGER;
      (aproperty->u).integer = *(FT_Int32 *)&pPVar2->value;
    }
    else {
      aproperty->type = BDF_PROPERTY_TYPE_ATOM;
      aproperty->u = *(anon_union_8_3_4cd875ef_for_u *)&pPVar2->value;
    }
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

static FT_Error
  pcf_get_bdf_property( PCF_Face          face,
                        const char*       prop_name,
                        BDF_PropertyRec  *aproperty )
  {
    PCF_Property  prop;


    prop = pcf_find_property( face, prop_name );
    if ( prop )
    {
      if ( prop->isString )
      {
        aproperty->type   = BDF_PROPERTY_TYPE_ATOM;
        aproperty->u.atom = prop->value.atom;
      }
      else
      {
        if ( prop->value.l > 0x7FFFFFFFL          ||
             prop->value.l < ( -1 - 0x7FFFFFFFL ) )
        {
          FT_TRACE1(( "pcf_get_bdf_property:" ));
          FT_TRACE1(( " too large integer 0x%x is truncated\n" ));
        }

        /*
         *  The PCF driver loads all properties as signed integers.
         *  This really doesn't seem to be a problem, because this is
         *  sufficient for any meaningful values.
         */
        aproperty->type      = BDF_PROPERTY_TYPE_INTEGER;
        aproperty->u.integer = (FT_Int32)prop->value.l;
      }

      return FT_Err_Ok;
    }

    return FT_THROW( Invalid_Argument );
  }